

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

bool tinyusdz::inverse(matrix4d *_m,matrix4d *inv_m,double eps)

{
  double dVar1;
  double dVar2;
  long lVar3;
  mat<double,_4,_4> *a;
  bool bVar4;
  double *pdVar5;
  mat<double,_4,_4> *pmVar6;
  byte bVar7;
  matrix44d inv_m_1;
  mat<double,_4,_4> local_118;
  mat<double,_4,_4> local_98;
  
  bVar7 = 0;
  pdVar5 = (double *)_m;
  pmVar6 = &local_118;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pmVar6->x).x = *pdVar5;
    pdVar5 = pdVar5 + 1;
    pmVar6 = (mat<double,_4,_4> *)&(pmVar6->x).y;
  }
  dVar1 = linalg::determinant<double>(&local_118);
  dVar1 = ABS(dVar1);
  bVar4 = true;
  if (eps < dVar1) {
    dVar2 = dVar1;
    if (dVar1 <= 0.0) {
      dVar2 = 0.0;
    }
    bVar4 = dVar1 <= dVar2 * eps;
  }
  if (bVar4 == false) {
    pmVar6 = &local_118;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pmVar6->x).x = _m->m[0][0];
      _m = (matrix4d *)((long)_m + ((ulong)bVar7 * -2 + 1) * 8);
      pmVar6 = (mat<double,_4,_4> *)((long)pmVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    linalg::inverse<double,4>(&local_98,(linalg *)&local_118,a);
    inv_m->m[0][0] = local_98.x.x;
    inv_m->m[0][1] = local_98.x.y;
    inv_m->m[0][2] = local_98.x.z;
    inv_m->m[0][3] = local_98.x.w;
    inv_m->m[1][0] = local_98.y.x;
    inv_m->m[1][1] = local_98.y.y;
    inv_m->m[1][2] = local_98.y.z;
    inv_m->m[1][3] = local_98.y.w;
    inv_m->m[2][0] = local_98.z.x;
    inv_m->m[2][1] = local_98.z.y;
    inv_m->m[2][2] = local_98.z.z;
    inv_m->m[2][3] = local_98.z.w;
    inv_m->m[3][0] = local_98.w.x;
    inv_m->m[3][1] = local_98.w.y;
    inv_m->m[3][2] = local_98.w.z;
    inv_m->m[3][3] = local_98.w.w;
  }
  return (bool)(bVar4 ^ 1);
}

Assistant:

bool inverse(const value::matrix4d &_m, value::matrix4d &inv_m, double eps) {
  double det = determinant(_m);

  if (math::is_close(std::fabs(det), 0.0, eps)) {
    return false;
  }

  inv_m = inverse(_m);
  return true;
}